

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O3

void helper_crypto_sha512h_arm(void *vd,void *vn,void *vm)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint64_t *rm;
  ulong uVar4;
  uint64_t *rn;
  
  uVar1 = *(ulong *)((long)vm + 8);
  uVar2 = *vn;
  lVar3 = ((uVar1 << 0x17 | uVar1 >> 0x29) ^
          (uVar1 << 0x2e | uVar1 >> 0x12) ^ (uVar1 << 0x32 | uVar1 >> 0xe)) +
          *(long *)((long)vd + 8) +
          ((*(ulong *)((long)vn + 8) ^ uVar2) & uVar1 ^ *(ulong *)((long)vn + 8));
  uVar4 = *vm + lVar3;
  *(ulong *)vd = ((uVar1 ^ uVar2) & uVar4 ^ uVar2) + *vd +
                 ((uVar4 * 0x800000 | uVar4 >> 0x29) ^
                 (uVar4 << 0x2e | uVar4 >> 0x12) ^ (uVar4 << 0x32 | uVar4 >> 0xe));
  *(long *)((long)vd + 8) = lVar3;
  return;
}

Assistant:

void HELPER(crypto_sha512h)(void *vd, void *vn, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    uint64_t d0 = rd[0];
    uint64_t d1 = rd[1];

    d1 += S1_512(rm[1]) + cho512(rm[1], rn[0], rn[1]);
    d0 += S1_512(d1 + rm[0]) + cho512(d1 + rm[0], rm[1], rn[0]);

    rd[0] = d0;
    rd[1] = d1;
}